

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::setOneWayMapping
          (Normalizer2DataBuilder *this,UChar32 c,UnicodeString *m)

{
  UBool UVar1;
  Norm *p_00;
  Norm *this_00;
  UnicodeString *this_01;
  UnicodeString *local_58;
  Norm *p;
  UnicodeString *m_local;
  UChar32 c_local;
  Normalizer2DataBuilder *this_local;
  
  UVar1 = isWellFormed(m);
  if (UVar1 == '\0') {
    fprintf(_stderr,
            "error in gennorm2 phase %d: illegal one-way mapping from U+%04lX to malformed string\n"
            ,(ulong)(uint)this->phase,(long)c);
    exit(3);
  }
  p_00 = Norms::createNorm(&this->norms,c);
  this_00 = checkNormForMapping(this,p_00,c);
  this_01 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)p_00);
  local_58 = (UnicodeString *)0x0;
  if (this_01 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(this_01,m);
    local_58 = this_01;
  }
  this_00->mapping = local_58;
  this_00->mappingType = ONE_WAY;
  Norm::setMappingCP(this_00);
  UnicodeSet::add(&(this->norms).mappingSet,c);
  return;
}

Assistant:

void Normalizer2DataBuilder::setOneWayMapping(UChar32 c, const UnicodeString &m) {
    if(!isWellFormed(m)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal one-way mapping from U+%04lX to malformed string\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    Norm *p=checkNormForMapping(norms.createNorm(c), c);
    p->mapping=new UnicodeString(m);
    p->mappingType=Norm::ONE_WAY;
    p->setMappingCP();
    norms.mappingSet.add(c);
}